

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sigs.h
# Opt level: O2

void __thiscall
sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::disconnect
          (BasicSignal<int_(),_std::lock_guard<std::mutex>_> *this,
          optional<std::shared_ptr<sigs::ConnectionBase>_> *conn)

{
  _Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_> _Stack_58;
  _Any_data local_40;
  code *local_30;
  
  if ((conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>)._M_payload.
      super__Optional_payload<std::shared_ptr<sigs::ConnectionBase>,_true,_false,_false>.
      super__Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>._M_engaged != false) {
    std::mutex::lock(&this->entriesMutex);
    std::_Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>::_Optional_base
              ((_Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false> *)&_Stack_58,
               &conn->super__Optional_base<std::shared_ptr<sigs::ConnectionBase>,_false,_false>);
    std::
    function<bool(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry*,std::vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>>)>
    ::
    function<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::disconnect(std::optional<std::shared_ptr<sigs::ConnectionBase>>const&)::_lambda(auto:1)_1_,void>
              ((function<bool(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry*,std::vector<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry,std::allocator<sigs::BasicSignal<int(),std::lock_guard<std::mutex>>::Entry>>>)>
                *)local_40._M_pod_data,(anon_class_24_1_898a5c2a *)&_Stack_58);
    eraseEntries(this,(function<bool_(__gnu_cxx::__normal_iterator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry_*,_std::vector<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry,_std::allocator<sigs::BasicSignal<int_(),_std::lock_guard<std::mutex>_>::Entry>_>_>)>
                       *)&local_40);
    if (local_30 != (code *)0x0) {
      (*local_30)(&local_40,&local_40,__destroy_functor);
    }
    std::_Optional_payload_base<std::shared_ptr<sigs::ConnectionBase>_>::_M_reset(&_Stack_58);
    pthread_mutex_unlock((pthread_mutex_t *)&this->entriesMutex);
    return;
  }
  clear(this);
  return;
}

Assistant:

void disconnect(const std::optional<Connection> &conn = std::nullopt) noexcept
  {
    if (!conn) {
      clear();
      return;
    }

    Lock lock(entriesMutex);
    eraseEntries([conn](auto it) { return it->conn() == conn; });
  }